

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution_x86::forwardDilation_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  size_t _elemsize;
  _func_int *p_Var7;
  _func_int **pp_Var8;
  size_t sVar9;
  size_t sVar10;
  Layer *pLVar11;
  ulong uVar12;
  int *piVar13;
  int iVar14;
  ulong uVar15;
  void *pvVar16;
  ulong uVar17;
  void *pvVar18;
  undefined4 *puVar19;
  ulong uVar20;
  undefined4 *puVar21;
  int iVar22;
  int iVar23;
  uint _w;
  long lVar24;
  undefined4 *puVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  uint _h;
  bool bVar29;
  Option opt_g;
  long local_180;
  long local_178;
  Mat local_158;
  Mat local_108;
  long local_b8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  long local_80;
  undefined4 local_78;
  int iStack_74;
  Allocator *pAStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  p_Var7 = this->_vptr_Convolution_x86[-3];
  iVar3 = *(int *)(p_Var7 + 0x2c + (long)&(this->weight_winograd23_data).data);
  iVar4 = *(int *)(p_Var7 + 0x3c + (long)&(this->weight_winograd23_data).data);
  uVar5 = *(uint *)(p_Var7 + 0x34 + (long)&(this->weight_winograd23_data).data);
  uVar15 = (ulong)uVar5;
  iVar23 = (iVar3 + -1) * uVar5 + 1;
  iVar14 = (iVar1 - iVar23) / iVar4;
  iVar22 = iVar14 + 1;
  Mat::create(top_blob,iVar22,(iVar2 - iVar23) / iVar4 + 1,
              *(int *)(p_Var7 + 0x28 + (long)&(this->weight_winograd23_data).data),_elemsize,
              opt->blob_allocator);
  iVar23 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_108.cstep = 0;
    local_108.data = (void *)0x0;
    local_108.refcount._0_4_ = 0;
    local_108.refcount._4_4_ = 0;
    local_108.elemsize._0_4_ = 0;
    local_108.elemsize._4_4_ = 0;
    local_108.elempack = 0;
    local_108.allocator = (Allocator *)0x0;
    local_108.dims = 0;
    local_108.w = 0;
    local_108.h = 0;
    local_108.d = 0;
    local_108.c = 0;
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    bVar29 = 0 < (int)uVar5;
    if (0 < (int)uVar5) {
      local_b8 = (long)iVar14 * 4 + 4;
      local_80 = (long)(int)(iVar22 * uVar5) << 2;
      local_180 = 0;
      local_178 = 0;
      uVar17 = 0;
      do {
        uVar12 = (long)(int)((uVar5 + iVar2 + -1) - (int)uVar17) / (long)(int)uVar5;
        iVar14 = (int)uVar12;
        uVar20 = (long)(iVar14 - iVar3) / (long)iVar4;
        local_90 = uVar20 & 0xffffffff;
        _h = (int)uVar20 + 1;
        uVar20 = 0;
        local_b0 = uVar17;
        local_a8 = local_178;
        local_a0 = local_180;
        do {
          uVar17 = (long)(int)((uVar5 + iVar1 + -1) - (int)uVar20) / (long)(int)uVar5;
          iVar22 = (int)uVar17;
          iVar23 = (iVar22 - iVar3) / iVar4;
          local_98 = uVar20;
          Mat::create(&local_108,iVar22,iVar14,bottom_blob->c,_elemsize,opt->workspace_allocator);
          if ((local_108.data == (void *)0x0) || ((long)local_108.c * local_108.cstep == 0)) {
LAB_001b5ad1:
            iVar23 = -100;
            if (bVar29) goto LAB_001b5b04;
            goto LAB_001b5ae5;
          }
          _w = iVar23 + 1;
          Mat::create(&local_158,_w,_h,
                      *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                              (long)&(this->weight_winograd23_data).data),_elemsize,
                      opt->workspace_allocator);
          if ((local_158.data == (void *)0x0) || ((long)local_158.c * local_158.cstep == 0))
          goto LAB_001b5ad1;
          iVar6 = bottom_blob->c;
          if (0 < (long)iVar6) {
            lVar24 = (long)bottom_blob->data + local_178;
            local_88 = bottom_blob->cstep * bottom_blob->elemsize;
            lVar26 = 0;
            pvVar16 = local_108.data;
            do {
              if (0 < iVar14) {
                iVar27 = 0;
                uVar20 = 0;
                pvVar18 = pvVar16;
                do {
                  if (0 < iVar22) {
                    puVar19 = (undefined4 *)(lVar24 + (long)iVar27 * 4);
                    uVar28 = 0;
                    do {
                      *(undefined4 *)((long)pvVar18 + uVar28 * 4) = *puVar19;
                      uVar28 = uVar28 + 1;
                      puVar19 = puVar19 + uVar15;
                    } while ((uVar17 & 0xffffffff) != uVar28);
                  }
                  uVar20 = uVar20 + 1;
                  iVar27 = iVar27 + uVar5 * iVar1;
                  pvVar18 = (void *)((long)pvVar18 + (long)iVar22 * 4);
                } while (uVar20 != (uVar12 & 0xffffffff));
              }
              lVar26 = lVar26 + 1;
              lVar24 = lVar24 + local_88;
              pvVar16 = (void *)((long)pvVar16 +
                                local_108.cstep *
                                CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
            } while (lVar26 != iVar6);
          }
          local_78 = *(undefined4 *)opt;
          iStack_74 = opt->num_threads;
          local_68 = *(undefined4 *)&opt->workspace_allocator;
          uStack_64 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
          iStack_60 = opt->openmp_blocktime;
          uStack_5c._0_1_ = opt->use_winograd_convolution;
          uStack_5c._1_1_ = opt->use_sgemm_convolution;
          uStack_5c._2_1_ = opt->use_int8_inference;
          uStack_5c._3_1_ = opt->use_vulkan_compute;
          local_58._0_1_ = opt->use_bf16_storage;
          local_58._1_1_ = opt->use_fp16_packed;
          local_58._2_1_ = opt->use_fp16_storage;
          local_58._3_1_ = opt->use_fp16_arithmetic;
          uStack_54._0_1_ = opt->use_int8_packed;
          uStack_54._1_1_ = opt->use_int8_storage;
          uStack_54._2_1_ = opt->use_int8_arithmetic;
          uStack_54._3_1_ = opt->use_packing_layout;
          uStack_50._0_1_ = opt->use_shader_pack8;
          uStack_50._1_1_ = opt->use_subgroup_basic;
          uStack_50._2_1_ = opt->use_subgroup_vote;
          uStack_50._3_1_ = opt->use_subgroup_ballot;
          uStack_4c._0_1_ = opt->use_subgroup_shuffle;
          uStack_4c._1_1_ = opt->use_image_storage;
          uStack_4c._2_1_ = opt->use_tensor_storage;
          uStack_4c._3_1_ = opt->use_reserved_0;
          local_48 = opt->flush_denormals;
          uStack_44._0_1_ = opt->use_local_pool_allocator;
          uStack_44._1_1_ = opt->use_shader_local_memory;
          uStack_44._2_1_ = opt->use_cooperative_matrix;
          uStack_44._3_1_ = opt->use_winograd23_convolution;
          uStack_40._0_1_ = opt->use_winograd43_convolution;
          uStack_40._1_1_ = opt->use_winograd63_convolution;
          uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
          uStack_40._3_1_ = opt->use_reserved_7;
          uStack_3c._0_1_ = opt->use_reserved_8;
          uStack_3c._1_1_ = opt->use_reserved_9;
          uStack_3c._2_1_ = opt->use_reserved_10;
          uStack_3c._3_1_ = opt->use_reserved_11;
          pAStack_70 = local_158.allocator;
          (*this->convolution_dilation1->_vptr_Layer[7])
                    (this->convolution_dilation1,&local_108,&local_158,&local_78);
          pp_Var8 = this->_vptr_Convolution_x86;
          if (0 < *(int *)(pp_Var8[-3] + 0x28 + (long)&(this->weight_winograd23_data).data)) {
            sVar9 = top_blob->cstep;
            puVar19 = (undefined4 *)((long)top_blob->data + local_180);
            sVar10 = top_blob->elemsize;
            lVar24 = 0;
            pvVar16 = local_158.data;
            do {
              if (-1 < (int)local_90) {
                uVar17 = 0;
                puVar25 = puVar19;
                pvVar18 = pvVar16;
                do {
                  if (-1 < iVar23) {
                    uVar20 = 0;
                    puVar21 = puVar25;
                    do {
                      *puVar21 = *(undefined4 *)((long)pvVar18 + uVar20 * 4);
                      uVar20 = uVar20 + 1;
                      puVar21 = puVar21 + uVar15;
                    } while (_w != uVar20);
                  }
                  uVar17 = uVar17 + 1;
                  puVar25 = (undefined4 *)((long)puVar25 + local_80);
                  pvVar18 = (void *)((long)pvVar18 + (long)(int)_w * 4);
                } while (uVar17 != _h);
              }
              lVar24 = lVar24 + 1;
              puVar19 = (undefined4 *)((long)puVar19 + sVar9 * sVar10);
              pvVar16 = (void *)((long)pvVar16 +
                                local_158.cstep *
                                CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize));
            } while (lVar24 < *(int *)(pp_Var8[-3] + 0x28 +
                                      (long)&(this->weight_winograd23_data).data));
          }
          uVar20 = local_98 + 1;
          local_178 = local_178 + 4;
          local_180 = local_180 + 4;
        } while (uVar20 != uVar15);
        uVar17 = local_b0 + 1;
        bVar29 = uVar17 < uVar15;
        local_178 = local_a8 + (long)iVar1 * 4;
        local_180 = local_a0 + local_b8;
      } while (uVar17 != uVar15);
    }
LAB_001b5ae5:
    pLVar11 = this->activation;
    if (pLVar11 == (Layer *)0x0) {
      iVar23 = 0;
    }
    else {
      (*pLVar11->_vptr_Layer[9])(pLVar11,top_blob,opt);
      iVar23 = 0;
    }
LAB_001b5b04:
    piVar13 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    piVar13 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_108.allocator == (Allocator *)0x0) {
          if (local_108.data != (void *)0x0) {
            free(local_108.data);
          }
        }
        else {
          (*(local_108.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar23;
}

Assistant:

int Convolution_x86::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}